

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::find_or_prepare_insert_non_soo<char[22]>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *this,char (*key) [22])

{
  ctrl_t *pcVar1;
  long lVar2;
  ctrl_t *pcVar3;
  void *pvVar4;
  uint uVar5;
  ushort uVar6;
  ctrl_t cVar7;
  ctrl_t cVar8;
  ctrl_t cVar9;
  ctrl_t cVar10;
  ctrl_t cVar11;
  ctrl_t cVar12;
  ctrl_t cVar13;
  ctrl_t cVar14;
  undefined8 uVar15;
  undefined1 uVar16;
  bool bVar17;
  ushort uVar18;
  size_t sVar19;
  uint64_t uVar20;
  size_t sVar21;
  ctrl_t *pcVar22;
  bool bVar23;
  ulong uVar24;
  anon_union_8_1_a8a14541_for_iterator_2 aVar25;
  uint uVar26;
  PolicyFunctions *pPVar27;
  PolicyFunctions *policy;
  ulong uVar28;
  CommonFields *common;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  FindInfo target;
  __m128i match;
  ulong local_b8;
  ctrl_t local_98;
  ctrl_t cStack_97;
  ctrl_t cStack_96;
  ctrl_t cStack_95;
  ctrl_t cStack_94;
  ctrl_t cStack_93;
  ctrl_t cStack_92;
  ctrl_t cStack_91;
  _Head_base<0UL,_const_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_80;
  _Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  local_78;
  ulong local_70;
  CommonFields *local_68;
  char (*local_60) [22];
  undefined1 local_58 [16];
  char (*local_40) [22];
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  sVar19 = strlen(*key);
  local_60 = key;
  uVar20 = hash_internal::MixingHashState::CombineContiguousImpl
                     (&hash_internal::MixingHashState::kSeed,key,sVar19);
  uVar24 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           capacity_;
  if ((uVar24 + 1 & uVar24) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar28 = (uVar20 ^ sVar19) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar28 >> 0x38 | (uVar28 & 0xff000000000000) >> 0x28 | (uVar28 & 0xff0000000000) >> 0x18
            | (uVar28 & 0xff00000000) >> 8 | (uVar28 & 0xff000000) << 8 |
            (uVar28 & 0xff0000) << 0x18 | (uVar28 & 0xff00) << 0x28 | uVar28 << 0x38);
  pcVar1 = (this->settings_).
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
           heap_or_soo_.heap.control;
  pPVar27 = (PolicyFunctions *)(((ulong)common >> 7 ^ (ulong)pcVar1 >> 0xc) & uVar24);
  uVar16 = (undefined1)(uVar28 >> 0x38);
  auVar30 = ZEXT216(CONCAT11(uVar16,uVar16) & 0x7f7f);
  auVar30 = pshuflw(auVar30,auVar30,0);
  local_58._0_4_ = auVar30._0_4_;
  local_58._4_4_ = local_58._0_4_;
  local_58._8_4_ = local_58._0_4_;
  local_58._12_4_ = local_58._0_4_;
  pcVar22 = (__return_storage_ptr__->first).ctrl_;
  aVar25 = (__return_storage_ptr__->first).field_1;
  bVar23 = __return_storage_ptr__->second;
  local_b8 = 0;
  do {
    pcVar3 = (ctrl_t *)((long)&pPVar27->slot_size + (long)pcVar1);
    local_98 = *pcVar3;
    cStack_97 = pcVar3[1];
    cStack_96 = pcVar3[2];
    cStack_95 = pcVar3[3];
    cStack_94 = pcVar3[4];
    cStack_93 = pcVar3[5];
    cStack_92 = pcVar3[6];
    cStack_91 = pcVar3[7];
    uVar15 = *(undefined8 *)pcVar3;
    cVar7 = pcVar3[8];
    cVar8 = pcVar3[9];
    cVar9 = pcVar3[10];
    cVar10 = pcVar3[0xb];
    cVar11 = pcVar3[0xc];
    cVar12 = pcVar3[0xd];
    cVar13 = pcVar3[0xe];
    cVar14 = pcVar3[0xf];
    auVar30[0] = -(local_58[0] == local_98);
    auVar30[1] = -(local_58[1] == cStack_97);
    auVar30[2] = -(local_58[2] == cStack_96);
    auVar30[3] = -(local_58[3] == cStack_95);
    auVar30[4] = -(local_58[4] == cStack_94);
    auVar30[5] = -(local_58[5] == cStack_93);
    auVar30[6] = -(local_58[6] == cStack_92);
    auVar30[7] = -(local_58[7] == cStack_91);
    auVar30[8] = -(local_58[8] == cVar7);
    auVar30[9] = -(local_58[9] == cVar8);
    auVar30[10] = -(local_58[10] == cVar9);
    auVar30[0xb] = -(local_58[0xb] == cVar10);
    auVar30[0xc] = -(local_58[0xc] == cVar11);
    auVar30[0xd] = -(local_58[0xd] == cVar12);
    auVar30[0xe] = -(local_58[0xe] == cVar13);
    auVar30[0xf] = -(local_58[0xf] == cVar14);
    uVar18 = (ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe | (ushort)(auVar30[0xf] >> 7) << 0xf;
    uVar26 = (uint)uVar18;
    while (uVar18 != 0) {
      uVar5 = 0;
      if (uVar26 != 0) {
        for (; (uVar26 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      lVar2 = *(long *)((long)&(this->settings_).
                               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_ + 8);
      uVar28 = (long)&pPVar27->slot_size + (ulong)uVar5 & uVar24;
      lVar29 = uVar28 * 0x30;
      local_78._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (lVar2 + lVar29 + 0x10);
      local_80._M_head_impl = (basic_string_view<char,_std::char_traits<char>_> *)(lVar2 + lVar29);
      local_70 = uVar24;
      local_68 = common;
      local_40 = local_60;
      local_38 = this;
      bVar17 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
               ::EqualElement<char[22]>::operator()
                         ((EqualElement<char[22]> *)&local_40,local_80._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
                          &local_80,
                          (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                           *)&local_78);
      if (bVar17) {
        (__return_storage_ptr__->first).field_1 = aVar25;
        __return_storage_ptr__->second = bVar23;
        (__return_storage_ptr__->first).ctrl_ = pcVar22;
        pcVar1 = (this->settings_).
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.heap_or_soo_.heap.control;
        if (pcVar1 != (ctrl_t *)0x0) {
          pvVar4 = (this->settings_).
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.slot_array.p;
          (__return_storage_ptr__->first).ctrl_ = pcVar1 + uVar28;
          (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar29 + (long)pvVar4);
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        goto LAB_001f8217;
      }
      uVar18 = (ushort)(uVar26 - 1) & (ushort)uVar26;
      uVar26 = CONCAT22((short)(uVar26 - 1 >> 0x10),uVar18);
      local_98 = (ctrl_t)uVar15;
      cStack_97 = (ctrl_t)((ulong)uVar15 >> 8);
      cStack_96 = (ctrl_t)((ulong)uVar15 >> 0x10);
      cStack_95 = (ctrl_t)((ulong)uVar15 >> 0x18);
      cStack_94 = (ctrl_t)((ulong)uVar15 >> 0x20);
      cStack_93 = (ctrl_t)((ulong)uVar15 >> 0x28);
      cStack_92 = (ctrl_t)((ulong)uVar15 >> 0x30);
      cStack_91 = (ctrl_t)((ulong)uVar15 >> 0x38);
      uVar24 = local_70;
      common = local_68;
    }
    auVar31[0] = -(local_98 == kEmpty);
    auVar31[1] = -(cStack_97 == kEmpty);
    auVar31[2] = -(cStack_96 == kEmpty);
    auVar31[3] = -(cStack_95 == kEmpty);
    auVar31[4] = -(cStack_94 == kEmpty);
    auVar31[5] = -(cStack_93 == kEmpty);
    auVar31[6] = -(cStack_92 == kEmpty);
    auVar31[7] = -(cStack_91 == kEmpty);
    auVar31[8] = -(cVar7 == kEmpty);
    auVar31[9] = -(cVar8 == kEmpty);
    auVar31[10] = -(cVar9 == kEmpty);
    auVar31[0xb] = -(cVar10 == kEmpty);
    auVar31[0xc] = -(cVar11 == kEmpty);
    auVar31[0xd] = -(cVar12 == kEmpty);
    auVar31[0xe] = -(cVar13 == kEmpty);
    auVar31[0xf] = -(cVar14 == kEmpty);
    uVar18 = (ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe | (ushort)(auVar31[0xf] >> 7) << 0xf;
    if (uVar18 == 0) {
      if ((this->settings_).
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_ < local_b8 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar25;
        __return_storage_ptr__->second = bVar23;
        (__return_storage_ptr__->first).ctrl_ = pcVar22;
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>, K = char[22]]"
                     );
      }
      pPVar27 = (PolicyFunctions *)((long)&pPVar27->hash_slot + local_b8 & uVar24);
      local_b8 = local_b8 + 0x10;
    }
    else {
      policy = pPVar27;
      bVar17 = ShouldInsertBackwardsForDebug
                         ((this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_,(size_t)common,
                          (this->settings_).
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control);
      if (bVar17) {
        uVar6 = 0xf;
        if (uVar18 != 0) {
          for (; uVar18 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar26 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar26 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
          }
        }
      }
      target.probe_length =
           (size_t)raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
                   ::GetPolicyFunctions()::value;
      target.offset = local_b8;
      sVar21 = PrepareInsertNonSoo((container_internal *)this,common,
                                   (long)&pPVar27->slot_size + (ulong)uVar26 & uVar24,target,policy)
      ;
      pcVar3 = (this->settings_).
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.control;
      if (pcVar3 == (ctrl_t *)0x0) {
        (__return_storage_ptr__->first).field_1 = aVar25;
        __return_storage_ptr__->second = bVar23;
        (__return_storage_ptr__->first).ctrl_ = pcVar22;
LAB_001f8217:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, std::basic_string<char>>>]"
                     );
      }
      pcVar22 = pcVar3 + sVar21;
      aVar25.slot_ = (slot_type *)
                     (sVar21 * 0x30 +
                     (long)(this->settings_).
                           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                           .
                           super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                           .value.heap_or_soo_.heap.slot_array.p);
      bVar23 = true;
    }
    if (uVar18 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar25;
      __return_storage_ptr__->second = bVar23;
      (__return_storage_ptr__->first).ctrl_ = pcVar22;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }